

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O0

ZyanStatus
ZydisFormatterIntelPrintDISP
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  uint uVar1;
  ZyanStatus ZVar2;
  ZyanU64 ZVar3;
  ZyanStatus status_047620348_9;
  ZyanStatus status_047620348_8;
  ZyanStatus status_047620348_7;
  ZyanStatus status_047620348_6;
  ZyanStatus status_047620348_5;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14a,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14b,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14c,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (formatter->disp_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
    if ((context->operand->field_10).mem.disp.value < 0) {
      if (((context->operand->field_10).mem.base != ZYDIS_REGISTER_NONE) ||
         ((context->operand->field_10).mem.index != ZYDIS_REGISTER_NONE)) {
        if (buffer->is_token_list == '\0') {
          uVar1 = ZydisStringAppendShort(&buffer->string,&STR_SUB);
        }
        else {
          uVar1 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_SUB)
          ;
        }
        if ((uVar1 & 0x80000000) != 0) {
          return uVar1;
        }
      }
      if ((buffer->is_token_list != '\0') &&
         (ZVar2 = ZydisFormatterBufferAppend(buffer,'\n'), (ZVar2 & 0x80000000) != 0)) {
        return ZVar2;
      }
      if (formatter->disp_base == ZYDIS_NUMERIC_BASE_DEC) {
        ZVar3 = ZyanAbsI64((context->operand->field_10).mem.disp.value);
        formatter_local._4_4_ =
             ZydisStringAppendDecU
                       (&buffer->string,ZVar3,(ZyanU8)formatter->disp_padding,
                        formatter->number_format[formatter->disp_base][0].string,
                        formatter->number_format[formatter->disp_base][1].string);
      }
      else {
        if (formatter->disp_base != ZYDIS_NUMERIC_BASE_HEX) {
          return 0x80100004;
        }
        ZVar3 = ZyanAbsI64((context->operand->field_10).mem.disp.value);
        formatter_local._4_4_ =
             ZydisStringAppendHexU
                       (&buffer->string,ZVar3,(ZyanU8)formatter->disp_padding,
                        formatter->hex_force_leading_number,formatter->hex_uppercase,
                        formatter->number_format[formatter->disp_base][0].string,
                        formatter->number_format[formatter->disp_base][1].string);
      }
      goto joined_r0x00134db4;
    }
  }
  else if (formatter->disp_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
    return 0x80100004;
  }
  if (((context->operand->field_10).mem.base != ZYDIS_REGISTER_NONE) ||
     ((context->operand->field_10).mem.index != ZYDIS_REGISTER_NONE)) {
    if (buffer->is_token_list == '\0') {
      uVar1 = ZydisStringAppendShort(&buffer->string,&STR_ADD);
    }
    else {
      uVar1 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_ADD);
    }
    if ((uVar1 & 0x80000000) != 0) {
      return uVar1;
    }
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar2 = ZydisFormatterBufferAppend(buffer,'\n'), (ZVar2 & 0x80000000) != 0)) {
    return ZVar2;
  }
  if (formatter->disp_base == ZYDIS_NUMERIC_BASE_DEC) {
    formatter_local._4_4_ =
         ZydisStringAppendDecU
                   (&buffer->string,(context->operand->field_10).mem.disp.value,
                    (ZyanU8)formatter->disp_padding,
                    formatter->number_format[formatter->disp_base][0].string,
                    formatter->number_format[formatter->disp_base][1].string);
  }
  else {
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_HEX) {
      return 0x80100004;
    }
    formatter_local._4_4_ =
         ZydisStringAppendHexU
                   (&buffer->string,(context->operand->field_10).mem.disp.value,
                    (ZyanU8)formatter->disp_padding,formatter->hex_force_leading_number,
                    formatter->hex_uppercase,
                    formatter->number_format[formatter->disp_base][0].string,
                    formatter->number_format[formatter->disp_base][1].string);
  }
joined_r0x00134db4:
  if ((formatter_local._4_4_ & 0x80000000) == 0) {
    formatter_local._4_4_ = 0x100000;
  }
  return formatter_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    switch (formatter->disp_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        if (context->operand->mem.disp.value < 0)
        {
            if ((context->operand->mem.base  != ZYDIS_REGISTER_NONE) ||
                (context->operand->mem.index != ZYDIS_REGISTER_NONE))
            {
                ZYDIS_BUFFER_APPEND(buffer, SUB);
            }
            ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
            ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
                ZyanAbsI64(context->operand->mem.disp.value), formatter->disp_padding,
                formatter->hex_force_leading_number);
            break;
        }
        ZYAN_FALLTHROUGH;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        if ((context->operand->mem.base  != ZYDIS_REGISTER_NONE) ||
            (context->operand->mem.index != ZYDIS_REGISTER_NONE))
        {
            ZYDIS_BUFFER_APPEND(buffer, ADD);
        }
        ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding,
            formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}